

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_8,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Vector<float,_2> *pVVar1;
  bool bVar2;
  int row;
  long lVar3;
  Vector<float,_2> *pVVar4;
  Vector<float,_3> *pVVar5;
  int col;
  long lVar6;
  bool bVar7;
  undefined8 *puVar8;
  int ndx;
  float v;
  float fVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  bool bVar13;
  undefined8 local_88;
  undefined1 auStack_80 [8];
  undefined8 local_78;
  Mat2x3 m_1;
  float local_54;
  Matrix<float,_2,_2> res;
  float afStack_40 [4];
  Mat3x2 m;
  long lVar12;
  
  pVVar1 = (Vector<float,_2> *)(res.m_data.m_data[1].m_data + 1);
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    pVVar4 = res.m_data.m_data + 1;
    bVar13 = true;
    do {
      bVar2 = bVar13;
      lVar6 = 0;
      auVar11 = _DAT_00a99400;
      do {
        bVar13 = SUB164(auVar11 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar11 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar13) {
          fVar9 = 1.0;
          if (lVar3 != lVar6) {
            fVar9 = 0.0;
          }
          pVVar4[lVar6].m_data[0] = fVar9;
        }
        if (bVar13) {
          fVar9 = 1.0;
          if (lVar3 + -1 != lVar6) {
            fVar9 = 0.0;
          }
          pVVar4[lVar6 + 1].m_data[0] = fVar9;
        }
        lVar6 = lVar6 + 2;
        lVar12 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar12 + 2;
      } while (lVar6 != 4);
      lVar3 = 1;
      pVVar4 = pVVar1;
      bVar13 = false;
    } while (bVar2);
    res.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[0].m_data;
  }
  else {
    res.m_data.m_data[1].m_data[0] = 0.0;
    res.m_data.m_data[1].m_data[1] = 0.0;
    lVar3 = 0;
    pVVar4 = res.m_data.m_data + 1;
    bVar13 = true;
    do {
      bVar2 = bVar13;
      lVar6 = 0;
      do {
        pVVar4[lVar6].m_data[0] =
             *(float *)((long)&sr::(anonymous_namespace)::s_constInMat3x2 + lVar3 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar3 = 0xc;
      pVVar4 = pVVar1;
      bVar13 = false;
    } while (bVar2);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar3 != 0) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)&local_88 + lVar3 * 4) = uVar10;
      uVar10 = 0x3f800000;
      if (lVar3 != 1) {
        uVar10 = 0;
      }
      *(undefined4 *)(auStack_80 + lVar3 * 4 + 4) = uVar10;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_88 = *(undefined8 *)evalCtx->in[0].m_data;
    auStack_80._4_4_ = evalCtx->in[1].m_data[0];
    auStack_80._0_4_ = evalCtx->in[0].m_data[2];
    local_78 = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  }
  else {
    local_88 = 0;
    auStack_80 = (undefined1  [8])0x0;
    local_78 = 0;
    lVar3 = 0;
    do {
      uVar10 = (&DAT_00af09ec)[lVar3 * 2];
      *(undefined4 *)((long)&local_88 + lVar3 * 4) = (&DAT_00af09e8)[lVar3 * 2];
      *(undefined4 *)(auStack_80 + lVar3 * 4 + 4) = uVar10;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  m_1.m_data.m_data[0].m_data[2] = 0.0;
  m_1.m_data.m_data[1].m_data[0] = 0.0;
  m_1.m_data.m_data[1].m_data[1] = 0.0;
  m_1.m_data.m_data[1].m_data[2] = 1.0;
  pVVar5 = (Vector<float,_3> *)(m_1.m_data.m_data[0].m_data + 2);
  pVVar4 = res.m_data.m_data + 1;
  bVar13 = true;
  do {
    bVar2 = bVar13;
    lVar3 = 0;
    puVar8 = &local_88;
    bVar13 = true;
    do {
      bVar7 = bVar13;
      fVar9 = 0.0;
      lVar6 = 0;
      do {
        fVar9 = fVar9 + pVVar4[lVar6].m_data[0] * *(float *)((long)puVar8 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      pVVar5->m_data[lVar3 * 2] = fVar9;
      lVar3 = 1;
      puVar8 = (undefined8 *)(auStack_80 + 4);
      bVar13 = false;
    } while (bVar7);
    pVVar5 = m_1.m_data.m_data + 1;
    pVVar4 = pVVar1;
    bVar13 = false;
  } while (bVar2);
  res.m_data.m_data[0].m_data[0] = m_1.m_data.m_data[1].m_data[1];
  res.m_data.m_data[0].m_data[1] = m_1.m_data.m_data[1].m_data[0] + m_1.m_data.m_data[1].m_data[2];
  m.m_data.m_data[1].m_data[0] = 0.0;
  m.m_data.m_data[1].m_data[1] = 1.4013e-45;
  m.m_data.m_data[2].m_data[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)m.m_data.m_data[0].m_data[lVar3]] =
         m_1.m_data.m_data[1].m_data[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}